

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaInternalErr2
               (xmlSchemaAbstractCtxtPtr actxt,char *funcName,char *message,xmlChar *str1,
               xmlChar *str2)

{
  xmlChar *pxVar1;
  int error;
  
  if (actxt == (xmlSchemaAbstractCtxtPtr)0x0) {
    return;
  }
  pxVar1 = xmlStrdup((xmlChar *)"Internal error: %s, ");
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)message);
  pxVar1 = xmlStrcat(pxVar1,".\n");
  if (actxt->type == 2) {
    error = 0x71a;
  }
  else {
    if (actxt->type != 1) goto LAB_001aa95f;
    error = 0xbfd;
  }
  xmlSchemaErr3(actxt,error,(xmlNodePtr)0x0,(char *)pxVar1,(xmlChar *)funcName,str1,(xmlChar *)0x0);
LAB_001aa95f:
  if (pxVar1 == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(pxVar1);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlSchemaInternalErr2(xmlSchemaAbstractCtxtPtr actxt,
		     const char *funcName,
		     const char *message,
		     const xmlChar *str1,
		     const xmlChar *str2)
{
    xmlChar *msg = NULL;

    if (actxt == NULL)
        return;
    msg = xmlStrdup(BAD_CAST "Internal error: %s, ");
    msg = xmlStrcat(msg, BAD_CAST message);
    msg = xmlStrcat(msg, BAD_CAST ".\n");

    if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR)
	xmlSchemaErr3(actxt, XML_SCHEMAV_INTERNAL, NULL,
	    (const char *) msg, (const xmlChar *) funcName, str1, str2);
    else if (actxt->type == XML_SCHEMA_CTXT_PARSER)
	xmlSchemaErr3(actxt, XML_SCHEMAP_INTERNAL, NULL,
	    (const char *) msg, (const xmlChar *) funcName, str1, str2);

    FREE_AND_NULL(msg)
}

static void LIBXML_ATTR_FORMAT(3,0)
xmlSchemaInternalErr(xmlSchemaAbstractCtxtPtr actxt,
		     const char *funcName,
		     const char *message)
{
    xmlSchemaInternalErr2(actxt, funcName, message, NULL, NULL);
}

#if 0
static void LIBXML_ATTR_FORMAT(3,0)
xmlSchemaPInternalErr(xmlSchemaParserCtxtPtr pctxt,
		     const char *funcName,
		     const char *message,
		     const xmlChar *str1,
		     const xmlChar *str2)
{
    xmlSchemaInternalErr2(ACTXT_CAST pctxt, funcName, message,
	str1, str2);
}